

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

void __thiscall re2::Compiler::AddRuneRangeUTF8(Compiler *this,Rune lo,Rune hi,bool foldcase)

{
  int iVar1;
  int iVar2;
  int local_48;
  int local_44;
  int i_3;
  int i_2;
  int id;
  int m;
  int n;
  uint8 uhi [4];
  uint8 ulo [4];
  uint m_1;
  int i_1;
  Rune max;
  int i;
  uint uStack_14;
  bool foldcase_local;
  Rune hi_local;
  Rune lo_local;
  Compiler *this_local;
  
  if (lo <= hi) {
    i = hi;
    uStack_14 = lo;
    _hi_local = this;
    if (((lo == 0x80) && (hi == 0x10ffff)) && ((this->reversed_ & 1U) == 0)) {
      Add_80_10ffff(this);
    }
    else {
      for (i_1 = 1; i_1 < 4; i_1 = i_1 + 1) {
        iVar1 = MaxRune(i_1);
        if (((int)uStack_14 <= iVar1) && (iVar1 < i)) {
          AddRuneRangeUTF8(this,uStack_14,iVar1,foldcase);
          AddRuneRangeUTF8(this,iVar1 + 1,i,foldcase);
          return;
        }
      }
      if (i < 0x80) {
        iVar1 = UncachedRuneByteSuffix(this,(uint8)uStack_14,(uint8)i,foldcase,0);
        AddSuffix(this,iVar1);
      }
      else {
        ulo[0] = '\x01';
        ulo[1] = '\0';
        ulo[2] = '\0';
        ulo[3] = '\0';
        for (; (int)ulo < 4; ulo = (uint8  [4])((int)ulo + 1)) {
          uhi = (uint8  [4])((1 << (ulo[0] * '\x06' & 0x1f)) - 1);
          if ((uStack_14 & ((uint)uhi ^ 0xffffffff)) != (i & ((uint)uhi ^ 0xffffffff))) {
            if ((uStack_14 & (uint)uhi) != 0) {
              AddRuneRangeUTF8(this,uStack_14,uStack_14 | (uint)uhi,foldcase);
              AddRuneRangeUTF8(this,(uStack_14 | (uint)uhi) + 1,i,foldcase);
              return;
            }
            if ((uint8  [4])(i & (uint)uhi) != uhi) {
              AddRuneRangeUTF8(this,uStack_14,(i & ((uint)uhi ^ 0xffffffff)) - 1,foldcase);
              AddRuneRangeUTF8(this,i & ((uint)uhi ^ 0xffffffff),i,foldcase);
              return;
            }
          }
        }
        iVar1 = runetochar((char *)&n,(Rune *)&stack0xffffffffffffffec);
        iVar2 = runetochar((char *)&m,&i);
        if (iVar1 != iVar2) {
          __assert_fail("(n) == (m)",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc"
                        ,0x2f2,"void re2::Compiler::AddRuneRangeUTF8(Rune, Rune, bool)");
        }
        i_3 = 0;
        local_48 = iVar1;
        if ((this->reversed_ & 1U) == 0) {
          while (local_48 = local_48 + -1, -1 < local_48) {
            if ((local_48 == iVar1 + -1) ||
               ((uhi[(long)local_48 + -4] < *(byte *)((long)&m + (long)local_48) && (local_48 != 0))
               )) {
              i_3 = CachedRuneByteSuffix
                              (this,uhi[(long)local_48 + -4],*(uint8 *)((long)&m + (long)local_48),
                               false,i_3);
            }
            else {
              i_3 = UncachedRuneByteSuffix
                              (this,uhi[(long)local_48 + -4],*(uint8 *)((long)&m + (long)local_48),
                               false,i_3);
            }
          }
        }
        else {
          for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
            if ((local_44 == 0) ||
               ((uhi[(long)local_44 + -4] == *(uint8 *)((long)&m + (long)local_44) &&
                (local_44 != iVar1 + -1)))) {
              i_3 = CachedRuneByteSuffix
                              (this,uhi[(long)local_44 + -4],*(uint8 *)((long)&m + (long)local_44),
                               false,i_3);
            }
            else {
              i_3 = UncachedRuneByteSuffix
                              (this,uhi[(long)local_44 + -4],*(uint8 *)((long)&m + (long)local_44),
                               false,i_3);
            }
          }
        }
        AddSuffix(this,i_3);
      }
    }
  }
  return;
}

Assistant:

void Compiler::AddRuneRangeUTF8(Rune lo, Rune hi, bool foldcase) {
  if (lo > hi)
    return;

  // Pick off 80-10FFFF as a common special case
  // that can bypass the slow rune_cache_.
  if (lo == 0x80 && hi == 0x10ffff && !reversed_) {
    Add_80_10ffff();
    return;
  }

  // Split range into same-length sized ranges.
  for (int i = 1; i < UTFmax; i++) {
    Rune max = MaxRune(i);
    if (lo <= max && max < hi) {
      AddRuneRangeUTF8(lo, max, foldcase);
      AddRuneRangeUTF8(max+1, hi, foldcase);
      return;
    }
  }

  // ASCII range is always a special case.
  if (hi < Runeself) {
    AddSuffix(UncachedRuneByteSuffix(static_cast<uint8>(lo),
                                     static_cast<uint8>(hi), foldcase, 0));
    return;
  }

  // Split range into sections that agree on leading bytes.
  for (int i = 1; i < UTFmax; i++) {
    uint m = (1<<(6*i)) - 1;  // last i bytes of a UTF-8 sequence
    if ((lo & ~m) != (hi & ~m)) {
      if ((lo & m) != 0) {
        AddRuneRangeUTF8(lo, lo|m, foldcase);
        AddRuneRangeUTF8((lo|m)+1, hi, foldcase);
        return;
      }
      if ((hi & m) != m) {
        AddRuneRangeUTF8(lo, (hi&~m)-1, foldcase);
        AddRuneRangeUTF8(hi&~m, hi, foldcase);
        return;
      }
    }
  }

  // Finally.  Generate byte matching equivalent for lo-hi.
  uint8 ulo[UTFmax], uhi[UTFmax];
  int n = runetochar(reinterpret_cast<char*>(ulo), &lo);
  int m = runetochar(reinterpret_cast<char*>(uhi), &hi);
  (void)m;  // USED(m)
  DCHECK_EQ(n, m);

  // The logic below encodes this thinking:
  //
  // 1. When we have built the whole suffix, we know that it cannot
  // possibly be a suffix of anything longer: in forward mode, nothing
  // else can occur before the leading byte; in reverse mode, nothing
  // else can occur after the last continuation byte or else the leading
  // byte would have to change. Thus, there is no benefit to caching
  // the first byte of the suffix whereas there is a cost involved in
  // cloning it if it begins a common prefix, which is fairly likely.
  //
  // 2. Conversely, the last byte of the suffix cannot possibly be a
  // prefix of anything because next == 0, so we will never want to
  // clone it, but it is fairly likely to be a common suffix. Perhaps
  // more so in reverse mode than in forward mode because the former is
  // "converging" towards lower entropy, but caching is still worthwhile
  // for the latter in cases such as 80-BF.
  //
  // 3. Handling the bytes between the first and the last is less
  // straightforward and, again, the approach depends on whether we are
  // "converging" towards lower entropy: in forward mode, a single byte
  // is unlikely to be part of a common suffix whereas a byte range
  // is more likely so; in reverse mode, a byte range is unlikely to
  // be part of a common suffix whereas a single byte is more likely
  // so. The same benefit versus cost argument applies here.
  int id = 0;
  if (reversed_) {
    for (int i = 0; i < n; i++) {
      // In reverse UTF-8 mode: cache the leading byte; don't cache the last
      // continuation byte; cache anything else iff it's a single byte (XX-XX).
      if (i == 0 || (ulo[i] == uhi[i] && i != n-1))
        id = CachedRuneByteSuffix(ulo[i], uhi[i], false, id);
      else
        id = UncachedRuneByteSuffix(ulo[i], uhi[i], false, id);
    }
  } else {
    for (int i = n-1; i >= 0; i--) {
      // In forward UTF-8 mode: don't cache the leading byte; cache the last
      // continuation byte; cache anything else iff it's a byte range (XX-YY).
      if (i == n-1 || (ulo[i] < uhi[i] && i != 0))
        id = CachedRuneByteSuffix(ulo[i], uhi[i], false, id);
      else
        id = UncachedRuneByteSuffix(ulo[i], uhi[i], false, id);
    }
  }
  AddSuffix(id);
}